

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

LogFormat * __thiscall
el::base::TypedConfigurations::unsafeGetConfigByRef<el::base::LogFormat>
          (TypedConfigurations *this,Level level,
          unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
          *confMap,char *confName)

{
  iterator iVar1;
  mapped_type *pmVar2;
  key_type local_18;
  Level local_14;
  
  local_14 = level;
  iVar1 = utils::std::
          _Hashtable<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&confMap->_M_h,&local_14);
  if (iVar1.super__Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true>._M_cur
      == (__node_type *)0x0) {
    _local_18 = CONCAT44(local_14,1);
    pmVar2 = utils::std::__detail::
             _Map_base<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)confMap,&local_18);
  }
  else {
    pmVar2 = (mapped_type *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_el::Level,_el::base::LogFormat>,_true>
                    ._M_cur + 0x10);
  }
  return pmVar2;
}

Assistant:

Conf_T& unsafeGetConfigByRef(Level level, std::unordered_map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::unordered_map<Level, Conf_T>::iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
      }
    }
    return it->second;
  }